

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsBrokerAddAlias(HelicsBroker broker,char *interfaceName,char *alias,HelicsError *err)

{
  Broker *pBVar1;
  HelicsError *in_RCX;
  char *in_RDX;
  char *in_RSI;
  Broker *brk;
  HelicsError *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  pBVar1 = getBroker(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (pBVar1 != (Broker *)0x0) {
    if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
      assignError(in_RCX,-4,"Interface name cannot be empty");
    }
    else if ((in_RDX == (char *)0x0) || (*in_RDX == '\0')) {
      assignError(in_RCX,-4,"Alias cannot be empty");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      (*pBVar1->_vptr_Broker[0x19])(pBVar1,local_38,local_30,local_48,local_40);
    }
  }
  return;
}

Assistant:

void helicsBrokerAddAlias(HelicsBroker broker, const char* interfaceName, const char* alias, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    if (interfaceName == nullptr || interfaceName[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidInterfaceName);
        return;
    }
    if (alias == nullptr || alias[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAliasName);
        return;
    }
    try {
        brk->addAlias(interfaceName, alias);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}